

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::deinit
          (TessellationShaderTessellationgl_TessCoord *this)

{
  pointer p_Var1;
  TessellationShaderUtils *this_00;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer p_Var5;
  float default_tess_levels [4];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long lVar4;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    uVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if (((uVar2 & 0x300) != 0) || (this->m_test_type != TESSELLATION_TEST_TYPE_TES)) {
      iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar4 = CONCAT44(extraout_var,iVar3);
      (**(code **)(lVar4 + 0x40))(0x8c8e,0);
      (**(code **)(lVar4 + 0x48))(0x8c8e,0,0);
      (**(code **)(lVar4 + 0x4e8))(0x8c89);
      uVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      if ((uVar2 & 0x300) != 0) {
        local_28 = 0x3f800000;
        uStack_24 = 0x3f800000;
        uStack_20 = 0x3f800000;
        uStack_1c = 0x3f800000;
        (**(code **)(lVar4 + 0xfd0))(0x8e73,&local_28);
        (**(code **)(lVar4 + 0xfd0))(0x8e74,&local_28);
      }
      (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
      (**(code **)(lVar4 + 0xd8))(0);
      if (this->m_bo_id != 0) {
        (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id);
        this->m_bo_id = 0;
      }
      if (this->m_broken_ts_id != 0) {
        (**(code **)(lVar4 + 0x470))();
        this->m_broken_ts_id = 0;
      }
      if (this->m_fs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
        this->m_fs_id = 0;
      }
      if (this->m_vs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
        this->m_vs_id = 0;
      }
      if (this->m_vao_id != 0) {
        (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
        this->m_vao_id = 0;
      }
      for (p_Var5 = (this->m_tests).
                    super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var1 = (this->m_tests).
                   super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish, p_Var5 != p_Var1; p_Var5 = p_Var5 + 1
          ) {
        deinitTestDescriptor(this,p_Var5);
      }
      p_Var5 = (this->m_tests).
               super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (p_Var1 != p_Var5) {
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish = p_Var5;
      }
      this_00 = this->m_utils_ptr;
      if (this_00 != (TessellationShaderUtils *)0x0) {
        TessellationShaderUtils::~TessellationShaderUtils(this_00);
        operator_delete(this_00,0x20);
        this->m_utils_ptr = (TessellationShaderUtils *)0x0;
      }
    }
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	if (glu::isContextTypeES(m_context.getRenderContext().getType()) && m_test_type == TESSELLATION_TEST_TYPE_TES)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Revert buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Restore GL_PATCH_VERTICES_EXT, GL_PATCH_DEFAULT_INNER_LEVEL and
	 * GL_PATCH_DEFAULT_OUTER_LEVEL values */
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		const float default_tess_levels[] = { 1.0f, 1.0f, 1.0f, 1.0f };
		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, default_tess_levels);
		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, default_tess_levels);
	}
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Free all ES objects we allocated for the test */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_broken_ts_id != 0)
	{
		gl.deleteShader(m_broken_ts_id);

		m_broken_ts_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Deinitialize all test descriptors */
	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(*it);
	}
	m_tests.clear();

	/* Release tessellation shader test utilities instance */
	if (m_utils_ptr != NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = NULL;
	}
}